

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymt.cpp
# Opt level: O0

string * __thiscall
ymt::GetSSShareLink_abi_cxx11_(string *__return_storage_ptr__,ymt *this,Parser *user)

{
  ulong uVar1;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  Parser *local_18;
  Parser *user_local;
  
  local_18 = (Parser *)this;
  user_local = (Parser *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    util::GetMachineIP_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&server_addr__abi_cxx11_,local_38);
    std::__cxx11::string::~string(local_38);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    Parser::GetAttribute_abi_cxx11_(&local_98,local_18,GROUP_NAME);
    std::operator+(&local_78,&local_98,'-');
    Parser::GetAttribute_abi_cxx11_(&local_c8,local_18,REMOTE_PORT);
    std::operator+(&local_58,&local_78,&local_c8);
    std::__cxx11::string::operator=((string *)&profile_name__abi_cxx11_,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Parser::GetAttribute_abi_cxx11_(&local_208,local_18,METHOD);
  std::operator+(&local_1e8,&local_208,':');
  Parser::GetAttribute_abi_cxx11_(&local_228,local_18,KEY);
  std::operator+(&local_1c8,&local_1e8,&local_228);
  std::operator+(&local_1a8,&local_1c8,'@');
  std::operator+(&local_188,&local_1a8,&server_addr__abi_cxx11_);
  std::operator+(&local_168,&local_188,':');
  Parser::GetAttribute_abi_cxx11_(&local_248,local_18,REMOTE_PORT);
  std::operator+(&local_148,&local_168,&local_248);
  util::GetEncodedBase64(&local_128,&local_148);
  std::operator+(&local_108,"ss://",&local_128);
  std::operator+(&local_e8,&local_108,"#");
  std::operator+(__return_storage_ptr__,&local_e8,&profile_name__abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  return __return_storage_ptr__;
}

Assistant:

string ymt::GetSSShareLink(Parser & user) {

	if (server_addr_.empty()) {
		server_addr_ = util::GetMachineIP();
	}

	if (profile_name_.empty()) {
		profile_name_ = user.GetAttribute(GROUP_NAME) + '-' + user.GetAttribute(REMOTE_PORT);
	}

	return "ss://" + util::GetEncodedBase64(user.GetAttribute(METHOD)
											+ ':'
											+ user.GetAttribute(KEY)
											+ '@'
											+ server_addr_
											+ ':'
											+ user.GetAttribute(REMOTE_PORT)) + "#" + profile_name_;
}